

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor.h
# Opt level: O2

void Eigen::internal::
     visitor_impl<Eigen::internal::max_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>,_Eigen::internal::visitor_evaluator<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>,_21>
     ::run(visitor_evaluator<Eigen::Matrix<float,_32,_1,_0,_32,_1>_> *mat,
          max_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_> *visitor)

{
  Scalar *pSVar1;
  float fVar2;
  
  visitor_impl<Eigen::internal::max_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>,_Eigen::internal::visitor_evaluator<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>,_20>
  ::run(mat,visitor);
  fVar2 = (mat->m_evaluator).
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>_>.m_data
          [0x14];
  pSVar1 = &(visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res;
  if (*pSVar1 <= fVar2 && fVar2 != *pSVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res = fVar2;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).row = 0x14;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).col = 0;
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
  static inline void run(const Derived &mat, Visitor& visitor)
  {
    visitor_impl<Visitor, Derived, UnrollCount-1>::run(mat, visitor);
    visitor(mat.coeff(row, col), row, col);
  }